

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

nni_msg * nni_msg_pull_up(nni_msg *m)

{
  nni_msg *m_00;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  size_t len;
  uint8_t *dst;
  nni_msg *m2;
  nni_msg *m_local;
  
  m2 = m;
  sVar2 = nni_chunk_room(&m->m_body);
  sVar3 = nni_msg_header_len(m2);
  if ((sVar3 <= sVar2) && (iVar1 = nni_atomic_get(&m2->m_refcnt), m_00 = m2, iVar1 == 1)) {
    pvVar4 = nni_msg_header(m2);
    sVar2 = nni_msg_header_len(m2);
    nni_msg_insert(m_00,pvVar4,sVar2);
    nni_msg_header_clear(m2);
    return m2;
  }
  sVar2 = nni_msg_len(m2);
  sVar3 = nni_msg_header_len(m2);
  iVar1 = nni_msg_alloc((nni_msg **)&dst,sVar2 + sVar3);
  if (iVar1 == 0) {
    pvVar4 = nni_msg_body((nni_msg *)dst);
    sVar2 = nni_msg_header_len(m2);
    pvVar5 = nni_msg_header(m2);
    memcpy(pvVar4,pvVar5,sVar2);
    pvVar5 = nni_msg_body(m2);
    sVar3 = nni_msg_len(m2);
    memcpy((void *)(sVar2 + (long)pvVar4),pvVar5,sVar3);
    nni_msg_free(m2);
    m_local = (nni_msg *)dst;
  }
  else {
    m_local = (nni_msg *)0x0;
  }
  return m_local;
}

Assistant:

nni_msg *
nni_msg_pull_up(nni_msg *m)
{
	// This implementation is optimized to ensure that this function
	// will not copy the message more than once, and it will not
	// allocate unless there is no other option.
	if (((nni_chunk_room(&m->m_body) < nni_msg_header_len(m))) ||
	    (nni_atomic_get(&m->m_refcnt) != 1)) {
		// We have to duplicate the message.
		nni_msg *m2;
		uint8_t *dst;
		size_t   len = nni_msg_len(m) + nni_msg_header_len(m);
		if (nni_msg_alloc(&m2, len) != 0) {
			return (NULL);
		}
		dst = nni_msg_body(m2);
		len = nni_msg_header_len(m);
		memcpy(dst, nni_msg_header(m), len);
		dst += len;
		memcpy(dst, nni_msg_body(m), nni_msg_len(m));
		nni_msg_free(m);
		return (m2);
	}

	// At this point, we have a unique instance of the message.
	// We also know that we have sufficient space in the message,
	// so this insert operation cannot fail.
	nni_msg_insert(m, nni_msg_header(m), nni_msg_header_len(m));
	nni_msg_header_clear(m);
	return (m);
}